

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O0

bool tinyusdz::tydra::detail::ToMaterialPrim
               (RenderScene *scene,string *abs_path,size_t material_id,Prim *dst,string *err)

{
  vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *this;
  value_type_conflict vVar1;
  int iVar2;
  bool bVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  float *pfVar6;
  size_type sVar7;
  ostream *poVar8;
  const_reference pvVar9;
  undefined1 local_9168 [8];
  Prim shaderNodePrim;
  Shader *node;
  iterator __end2;
  iterator __begin2;
  vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *__range2;
  Prim matPrim;
  Prim shaderPrim;
  string local_8750;
  Path local_8730;
  Animatable<float> local_8660;
  allocator local_8631;
  string local_8630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_85f0;
  undefined1 local_85d0 [8];
  Path connPath_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_84e0;
  ostringstream local_84c0 [8];
  ostringstream ss_e_25;
  allocator local_8341;
  string local_8340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8300;
  ostringstream local_82e0 [8];
  ostringstream ss_e_24;
  Animatable<tinyusdz::value::normal3f> local_8168;
  undefined1 local_8138 [8];
  normal3f n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80e8;
  undefined1 local_80c8 [8];
  Path connPath_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7fd8;
  ostringstream local_7fb8 [8];
  ostringstream ss_e_23;
  allocator local_7e39;
  string local_7e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7df8;
  ostringstream local_7dd8 [8];
  ostringstream ss_e_22;
  Animatable<float> local_7c60;
  allocator local_7c31;
  string local_7c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7bf0;
  undefined1 local_7bd0 [8];
  Path connPath_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7ae0;
  ostringstream local_7ac0 [8];
  ostringstream ss_e_21;
  allocator local_7941;
  string local_7940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7900;
  ostringstream local_78e0 [8];
  ostringstream ss_e_20;
  Animatable<float> local_7768;
  allocator local_7739;
  string local_7738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_76f8;
  undefined1 local_76d8 [8];
  Path connPath_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_75e8;
  ostringstream local_75c8 [8];
  ostringstream ss_e_19;
  allocator local_7449;
  string local_7448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7408;
  ostringstream local_73e8 [8];
  ostringstream ss_e_18;
  Animatable<float> local_7270;
  allocator local_7241;
  string local_7240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7200;
  undefined1 local_71e0 [8];
  Path connPath_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70f0;
  ostringstream local_70d0 [8];
  ostringstream ss_e_17;
  allocator local_6f51;
  string local_6f50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f10;
  ostringstream local_6ef0 [8];
  ostringstream ss_e_16;
  Animatable<float> local_6d78;
  allocator local_6d49;
  string local_6d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d08;
  undefined1 local_6ce8 [8];
  Path connPath_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6bf8;
  ostringstream local_6bd8 [8];
  ostringstream ss_e_15;
  allocator local_6a59;
  string local_6a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a18;
  ostringstream local_69f8 [8];
  ostringstream ss_e_14;
  Animatable<float> local_6880;
  allocator local_6851;
  string local_6850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6810;
  undefined1 local_67f0 [8];
  Path connPath_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6700;
  ostringstream local_66e0 [8];
  ostringstream ss_e_13;
  allocator local_6561;
  string local_6560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6520;
  ostringstream local_6500 [8];
  ostringstream ss_e_12;
  Animatable<float> local_6388;
  allocator local_6359;
  string local_6358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6318;
  undefined1 local_62f8 [8];
  Path connPath_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6208;
  ostringstream local_61e8 [8];
  ostringstream ss_e_11;
  allocator local_6069;
  string local_6068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6028;
  ostringstream local_6008 [8];
  ostringstream ss_e_10;
  Animatable<float> local_5e90;
  allocator local_5e61;
  string local_5e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e20;
  undefined1 local_5e00 [8];
  Path connPath_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d10;
  ostringstream local_5cf0 [8];
  ostringstream ss_e_9;
  allocator local_5b71;
  string local_5b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b30;
  ostringstream local_5b10 [8];
  ostringstream ss_e_8;
  Animatable<float> local_5998;
  allocator local_5969;
  string local_5968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5928;
  undefined1 local_5908 [8];
  Path connPath_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5818;
  ostringstream local_57f8 [8];
  ostringstream ss_e_7;
  allocator local_5679;
  string local_5678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5638;
  ostringstream local_5618 [8];
  ostringstream ss_e_6;
  Animatable<tinyusdz::value::color3f> local_54a0;
  undefined1 local_5470 [8];
  color3f col_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5420;
  undefined1 local_5400 [8];
  Path connPath_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5310;
  ostringstream local_52f0 [8];
  ostringstream ss_e_5;
  allocator local_5171;
  string local_5170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5130;
  ostringstream local_5110 [8];
  ostringstream ss_e_4;
  Animatable<tinyusdz::value::color3f> local_4f98;
  undefined1 local_4f68 [8];
  color3f col;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f18;
  undefined1 local_4ef8 [8];
  Path connPath_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e08;
  ostringstream local_4de8 [8];
  ostringstream ss_e_3;
  allocator local_4c69;
  string local_4c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c28;
  ostringstream local_4c08 [8];
  ostringstream ss_e_2;
  Animatable<tinyusdz::value::color3f> local_4a90;
  undefined1 local_4a60 [8];
  color3f diffuseCol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a10;
  undefined1 local_49f0 [8];
  Path connPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4900;
  ostringstream local_48e0 [8];
  ostringstream ss_e_1;
  allocator local_4761;
  string local_4760;
  uint local_473c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4718;
  ostringstream local_46f8 [8];
  ostringstream ss_e;
  uint local_457c;
  Animatable<int> local_4578;
  undefined1 local_4550 [8];
  UsdPreviewSurface surfaceShader;
  vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> shader_nodes;
  undefined1 local_15d8 [8];
  string abs_shader_path;
  undefined1 local_1598 [8];
  string abs_mat_path;
  Shader shader;
  Material mat;
  anon_class_16_2_2591ee82 ConstructUVTexture;
  RenderMaterial *rmat;
  string *err_local;
  Prim *dst_local;
  size_t material_id_local;
  string *abs_path_local;
  RenderScene *scene_local;
  
  pvVar4 = ::std::
           vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
           ::operator[](&scene->materials,material_id);
  mat.volume._552_8_ = scene;
  Material::Material((Material *)&shader.value.v_.vtable);
  ::std::__cxx11::string::operator=((string *)&shader.value.v_.vtable,(string *)pvVar4);
  Shader::Shader((Shader *)((long)&abs_mat_path.field_2 + 8));
  ::std::__cxx11::string::operator=((string *)(abs_mat_path.field_2._M_local_buf + 8),"defaultPBR");
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (abs_shader_path.field_2._M_local_buf + 8),(char *)abs_path);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1598,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&abs_shader_path.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shader.value.v_.vtable);
  ::std::__cxx11::string::~string((string *)(abs_shader_path.field_2._M_local_buf + 8));
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shader_nodes.
                    super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_1598);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shader_nodes.
                    super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&abs_mat_path.field_2 + 8));
  ::std::__cxx11::string::~string
            ((string *)
             &shader_nodes.super__Vector_base<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>::vector
            ((vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
             ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
  UsdPreviewSurface::UsdPreviewSurface((UsdPreviewSurface *)local_4550);
  ::std::__cxx11::string::operator=
            ((string *)
             &shader.super_UsdShadePrim._properties.
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"UsdPreviewSurface");
  TypedTerminalAttribute<tinyusdz::Token>::set_authored
            ((TypedTerminalAttribute<tinyusdz::Token> *)&surfaceShader.occlusion._blocked,true);
  local_457c = (uint)(((pvVar4->surfaceShader).useSpecularWorkflow & 1U) != 0);
  Animatable<int>::Animatable(&local_4578,(int *)&local_457c);
  TypedAttributeWithFallback<tinyusdz::Animatable<int>_>::operator=
            ((TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *)
             &surfaceShader.emissiveColor._blocked,&local_4578);
  Animatable<int>::~Animatable(&local_4578);
  bVar3 = ShaderParam<std::array<float,_3UL>_>::is_texture(&(pvVar4->surfaceShader).diffuseColor);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).diffuseColor.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_46f8);
      poVar8 = ::std::operator<<((ostream *)local_46f8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x3cb);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_46f8,
                                 "Invalid texture_id for \'diffuseColor\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_4718,&local_4738,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_4718);
        ::std::__cxx11::string::~string((string *)&local_4718);
        ::std::__cxx11::string::~string((string *)&local_4738);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_46f8);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).diffuseColor.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_4760,"diffuseColor",&local_4761);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_4760,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_4760);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4761);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_48e0);
      poVar8 = ::std::operator<<((ostream *)local_48e0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x3cf);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_48e0,"Failed to convert \'diffuseColor\' texture."
                                );
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_4900,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_4900);
        ::std::__cxx11::string::~string((string *)&local_4900);
        ::std::__cxx11::string::~string((string *)&connPath._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_48e0);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_4a30,local_1598);
    ::std::operator+(&local_4a10,&local_4a30,"diffuseColor");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&diffuseCol.b,"outputs:rgb",(allocator *)((long)&diffuseCol.g + 3));
    Path::Path((Path *)local_49f0,&local_4a10,(string *)&diffuseCol.b);
    ::std::__cxx11::string::~string((string *)&diffuseCol.b);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&diffuseCol.g + 3));
    ::std::__cxx11::string::~string((string *)&local_4a10);
    ::std::__cxx11::string::~string((string *)&local_4a30);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               ((long)&surfaceShader.super_ShaderNode.super_UsdShadePrim._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data + 0x10),(Path *)local_49f0);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               ((long)&surfaceShader.super_ShaderNode.super_UsdShadePrim._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data + 0x10));
    Path::~Path((Path *)local_49f0);
  }
  else {
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).diffuseColor.value,0);
    local_4a60._0_4_ = *pvVar5;
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).diffuseColor.value,1);
    local_4a60._4_4_ = *pvVar5;
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).diffuseColor.value,2);
    diffuseCol.r = *pvVar5;
    Animatable<tinyusdz::value::color3f>::Animatable(&local_4a90,(color3f *)local_4a60);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_value
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               ((long)&surfaceShader.super_ShaderNode.super_UsdShadePrim._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data + 0x10),&local_4a90);
    Animatable<tinyusdz::value::color3f>::~Animatable(&local_4a90);
  }
  bVar3 = ShaderParam<std::array<float,_3UL>_>::is_texture(&(pvVar4->surfaceShader).specularColor);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).specularColor.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_4c08);
      poVar8 = ::std::operator<<((ostream *)local_4c08,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x3e1);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_4c08,
                                 "Invalid texture_id for \'specularColor\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_4c28,&local_4c48,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_4c28);
        ::std::__cxx11::string::~string((string *)&local_4c28);
        ::std::__cxx11::string::~string((string *)&local_4c48);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_4c08);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).specularColor.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_4c68,"specularColor",&local_4c69);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_4c68,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_4c68);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c69);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_4de8);
      poVar8 = ::std::operator<<((ostream *)local_4de8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x3e5);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_4de8,
                                 "Failed to convert \'specularColor\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_4e08,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_1._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_4e08);
        ::std::__cxx11::string::~string((string *)&local_4e08);
        ::std::__cxx11::string::~string((string *)&connPath_1._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_4de8);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_4f38,local_1598);
    ::std::operator+(&local_4f18,&local_4f38,"specularColor");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&col.b,"outputs:rgb",(allocator *)((long)&col.g + 3));
    Path::Path((Path *)local_4ef8,&local_4f18,(string *)&col.b);
    ::std::__cxx11::string::~string((string *)&col.b);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&col.g + 3));
    ::std::__cxx11::string::~string((string *)&local_4f18);
    ::std::__cxx11::string::~string((string *)&local_4f38);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               &surfaceShader.useSpecularWorkflow._blocked,(Path *)local_4ef8);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               &surfaceShader.useSpecularWorkflow._blocked);
    Path::~Path((Path *)local_4ef8);
  }
  else {
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).specularColor.value,0);
    local_4f68._0_4_ = *pvVar5;
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).specularColor.value,1);
    local_4f68._4_4_ = *pvVar5;
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).specularColor.value,2);
    col.r = *pvVar5;
    Animatable<tinyusdz::value::color3f>::Animatable(&local_4f98,(color3f *)local_4f68);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               &surfaceShader.useSpecularWorkflow._blocked,&local_4f98);
    Animatable<tinyusdz::value::color3f>::~Animatable(&local_4f98);
  }
  bVar3 = ShaderParam<std::array<float,_3UL>_>::is_texture(&(pvVar4->surfaceShader).emissiveColor);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).emissiveColor.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_5110);
      poVar8 = ::std::operator<<((ostream *)local_5110,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x3f6);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_5110,
                                 "Invalid texture_id for \'emissiveColor\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_5130,&local_5150,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_5130);
        ::std::__cxx11::string::~string((string *)&local_5130);
        ::std::__cxx11::string::~string((string *)&local_5150);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_5110);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).emissiveColor.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5170,"emissiveColor",&local_5171);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_5170,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_5170);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5171);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_52f0);
      poVar8 = ::std::operator<<((ostream *)local_52f0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x3fa);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_52f0,
                                 "Failed to convert \'emissiveColor\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_5310,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_2._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_5310);
        ::std::__cxx11::string::~string((string *)&local_5310);
        ::std::__cxx11::string::~string((string *)&connPath_2._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_52f0);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_5440,local_1598);
    ::std::operator+(&local_5420,&local_5440,"emissiveColor");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&col_1.b,"outputs:rgb",(allocator *)((long)&col_1.g + 3));
    Path::Path((Path *)local_5400,&local_5420,(string *)&col_1.b);
    ::std::__cxx11::string::~string((string *)&col_1.b);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&col_1.g + 3));
    ::std::__cxx11::string::~string((string *)&local_5420);
    ::std::__cxx11::string::~string((string *)&local_5440);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               &surfaceShader.diffuseColor._blocked,(Path *)local_5400);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               &surfaceShader.diffuseColor._blocked);
    Path::~Path((Path *)local_5400);
  }
  else {
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).emissiveColor.value,0);
    local_5470._0_4_ = *pvVar5;
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).emissiveColor.value,1);
    local_5470._4_4_ = *pvVar5;
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).emissiveColor.value,2);
    col_1.r = *pvVar5;
    Animatable<tinyusdz::value::color3f>::Animatable(&local_54a0,(color3f *)local_5470);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
               &surfaceShader.diffuseColor._blocked,&local_54a0);
    Animatable<tinyusdz::value::color3f>::~Animatable(&local_54a0);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).metallic);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).metallic.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_5618);
      poVar8 = ::std::operator<<((ostream *)local_5618,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x40b);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_5618,
                                 "Invalid texture_id for \'metallic\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_5638,&local_5658,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_5638);
        ::std::__cxx11::string::~string((string *)&local_5638);
        ::std::__cxx11::string::~string((string *)&local_5658);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_5618);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).metallic.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5678,"metallic",&local_5679);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_5678,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_5678);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5679);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_57f8);
      poVar8 = ::std::operator<<((ostream *)local_57f8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x40f);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_57f8,"Failed to convert \'metallic\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_5818,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_3._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_5818);
        ::std::__cxx11::string::~string((string *)&local_5818);
        ::std::__cxx11::string::~string((string *)&connPath_3._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_57f8);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_5948,local_1598);
    ::std::operator+(&local_5928,&local_5948,"metallic");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5968,"outputs:r",&local_5969);
    Path::Path((Path *)local_5908,&local_5928,&local_5968);
    ::std::__cxx11::string::~string((string *)&local_5968);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5969);
    ::std::__cxx11::string::~string((string *)&local_5928);
    ::std::__cxx11::string::~string((string *)&local_5948);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.specularColor._blocked,(Path *)local_5908);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.specularColor._blocked);
    Path::~Path((Path *)local_5908);
  }
  else {
    Animatable<float>::Animatable(&local_5998,&(pvVar4->surfaceShader).metallic.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.specularColor._blocked,&local_5998);
    Animatable<float>::~Animatable(&local_5998);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).roughness);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).roughness.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_5b10);
      poVar8 = ::std::operator<<((ostream *)local_5b10,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x41c);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_5b10,
                                 "Invalid texture_id for \'roughness\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_5b30,&local_5b50,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_5b30);
        ::std::__cxx11::string::~string((string *)&local_5b30);
        ::std::__cxx11::string::~string((string *)&local_5b50);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_5b10);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).roughness.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5b70,"roughness",&local_5b71);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_5b70,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_5b70);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5b71);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_5cf0);
      poVar8 = ::std::operator<<((ostream *)local_5cf0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x420);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_5cf0,"Failed to convert \'roughness\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_5d10,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_4._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_5d10);
        ::std::__cxx11::string::~string((string *)&local_5d10);
        ::std::__cxx11::string::~string((string *)&connPath_4._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_5cf0);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_5e40,local_1598);
    ::std::operator+(&local_5e20,&local_5e40,"roughness");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5e60,"outputs:r",&local_5e61);
    Path::Path((Path *)local_5e00,&local_5e20,&local_5e60);
    ::std::__cxx11::string::~string((string *)&local_5e60);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5e61);
    ::std::__cxx11::string::~string((string *)&local_5e20);
    ::std::__cxx11::string::~string((string *)&local_5e40);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.clearcoatRoughness._blocked,(Path *)local_5e00);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.clearcoatRoughness._blocked);
    Path::~Path((Path *)local_5e00);
  }
  else {
    Animatable<float>::Animatable(&local_5e90,&(pvVar4->surfaceShader).roughness.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.clearcoatRoughness._blocked,&local_5e90);
    Animatable<float>::~Animatable(&local_5e90);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).clearcoat);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).clearcoat.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_6008);
      poVar8 = ::std::operator<<((ostream *)local_6008,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x42d);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_6008,
                                 "Invalid texture_id for \'clearcoat\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_6028,&local_6048,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_6028);
        ::std::__cxx11::string::~string((string *)&local_6028);
        ::std::__cxx11::string::~string((string *)&local_6048);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6008);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).clearcoat.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6068,"clearcoat",&local_6069);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_6068,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_6068);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6069);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_61e8);
      poVar8 = ::std::operator<<((ostream *)local_61e8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x431);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_61e8,"Failed to convert \'clearcoat\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_6208,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_5._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_6208);
        ::std::__cxx11::string::~string((string *)&local_6208);
        ::std::__cxx11::string::~string((string *)&connPath_5._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_61e8);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_6338,local_1598);
    ::std::operator+(&local_6318,&local_6338,"clearcoat");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6358,"outputs:r",&local_6359);
    Path::Path((Path *)local_62f8,&local_6318,&local_6358);
    ::std::__cxx11::string::~string((string *)&local_6358);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6359);
    ::std::__cxx11::string::~string((string *)&local_6318);
    ::std::__cxx11::string::~string((string *)&local_6338);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.metallic._blocked,(Path *)local_62f8);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.metallic._blocked);
    Path::~Path((Path *)local_62f8);
  }
  else {
    Animatable<float>::Animatable(&local_6388,&(pvVar4->surfaceShader).clearcoat.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.metallic._blocked,&local_6388);
    Animatable<float>::~Animatable(&local_6388);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).clearcoatRoughness);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).clearcoatRoughness.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_6500);
      poVar8 = ::std::operator<<((ostream *)local_6500,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x43e);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_6500,
                                 "Invalid texture_id for \'clearcoatRoughness\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_6520,&local_6540,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_6520);
        ::std::__cxx11::string::~string((string *)&local_6520);
        ::std::__cxx11::string::~string((string *)&local_6540);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6500);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,
                          (long)(pvVar4->surfaceShader).clearcoatRoughness.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6560,"clearcoatRoughness",&local_6561);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_6560,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_6560);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6561);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_66e0);
      poVar8 = ::std::operator<<((ostream *)local_66e0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x442);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_66e0,
                                 "Failed to convert \'clearcoatRoughness\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_6700,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_6._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_6700);
        ::std::__cxx11::string::~string((string *)&local_6700);
        ::std::__cxx11::string::~string((string *)&connPath_6._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_66e0);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_6830,local_1598);
    ::std::operator+(&local_6810,&local_6830,"clearcoatRoughness");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6850,"outputs:r",&local_6851);
    Path::Path((Path *)local_67f0,&local_6810,&local_6850);
    ::std::__cxx11::string::~string((string *)&local_6850);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6851);
    ::std::__cxx11::string::~string((string *)&local_6810);
    ::std::__cxx11::string::~string((string *)&local_6830);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.clearcoat._blocked,(Path *)local_67f0);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.clearcoat._blocked);
    Path::~Path((Path *)local_67f0);
  }
  else {
    Animatable<float>::Animatable(&local_6880,&(pvVar4->surfaceShader).clearcoatRoughness.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.clearcoat._blocked,&local_6880);
    Animatable<float>::~Animatable(&local_6880);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).opacity);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).opacity.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_69f8);
      poVar8 = ::std::operator<<((ostream *)local_69f8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x44f);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_69f8,"Invalid texture_id for \'opacity\' texture."
                                );
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_6a18,&local_6a38,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_6a18);
        ::std::__cxx11::string::~string((string *)&local_6a18);
        ::std::__cxx11::string::~string((string *)&local_6a38);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_69f8);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).opacity.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6a58,"opacity",&local_6a59);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_6a58,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_6a58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6a59);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_6bd8);
      poVar8 = ::std::operator<<((ostream *)local_6bd8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x453);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_6bd8,"Failed to convert \'opacity\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_6bf8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_7._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_6bf8);
        ::std::__cxx11::string::~string((string *)&local_6bf8);
        ::std::__cxx11::string::~string((string *)&connPath_7._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6bd8);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_6d28,local_1598);
    ::std::operator+(&local_6d08,&local_6d28,"opacity");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6d48,"outputs:r",&local_6d49);
    Path::Path((Path *)local_6ce8,&local_6d08,&local_6d48);
    ::std::__cxx11::string::~string((string *)&local_6d48);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6d49);
    ::std::__cxx11::string::~string((string *)&local_6d08);
    ::std::__cxx11::string::~string((string *)&local_6d28);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.roughness._blocked,(Path *)local_6ce8);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.roughness._blocked);
    Path::~Path((Path *)local_6ce8);
  }
  else {
    Animatable<float>::Animatable(&local_6d78,&(pvVar4->surfaceShader).opacity.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.roughness._blocked,&local_6d78);
    Animatable<float>::~Animatable(&local_6d78);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).opacityThreshold);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).opacityThreshold.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_6ef0);
      poVar8 = ::std::operator<<((ostream *)local_6ef0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x460);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_6ef0,
                                 "Invalid texture_id for \'opacityThreshold\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_6f10,&local_6f30,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_6f10);
        ::std::__cxx11::string::~string((string *)&local_6f10);
        ::std::__cxx11::string::~string((string *)&local_6f30);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6ef0);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).opacityThreshold.texture_id
                         );
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6f50,"opacityThreshold",&local_6f51);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_6f50,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_6f50);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6f51);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_70d0);
      poVar8 = ::std::operator<<((ostream *)local_70d0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x464);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_70d0,
                                 "Failed to convert \'opacityThreshold\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_70f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_8._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_70f0);
        ::std::__cxx11::string::~string((string *)&local_70f0);
        ::std::__cxx11::string::~string((string *)&connPath_8._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_70d0);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_7220,local_1598);
    ::std::operator+(&local_7200,&local_7220,"opacityThreshold");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7240,"outputs:r",&local_7241);
    Path::Path((Path *)local_71e0,&local_7200,&local_7240);
    ::std::__cxx11::string::~string((string *)&local_7240);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7241);
    ::std::__cxx11::string::~string((string *)&local_7200);
    ::std::__cxx11::string::~string((string *)&local_7220);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.opacity._blocked,(Path *)local_71e0);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.opacity._blocked);
    Path::~Path((Path *)local_71e0);
  }
  else {
    Animatable<float>::Animatable(&local_7270,&(pvVar4->surfaceShader).opacityThreshold.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.opacity._blocked,&local_7270);
    Animatable<float>::~Animatable(&local_7270);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).ior);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).ior.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_73e8);
      poVar8 = ::std::operator<<((ostream *)local_73e8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x471);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_73e8,"Invalid texture_id for \'ior\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_7408,&local_7428,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_7408);
        ::std::__cxx11::string::~string((string *)&local_7408);
        ::std::__cxx11::string::~string((string *)&local_7428);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_73e8);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).ior.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7448,"ior",&local_7449);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_7448,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_7448);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7449);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_75c8);
      poVar8 = ::std::operator<<((ostream *)local_75c8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x475);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_75c8,"Failed to convert \'ior\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_75e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_9._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_75e8);
        ::std::__cxx11::string::~string((string *)&local_75e8);
        ::std::__cxx11::string::~string((string *)&connPath_9._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_75c8);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_7718,local_1598);
    ::std::operator+(&local_76f8,&local_7718,"ior");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7738,"outputs:r",&local_7739);
    Path::Path((Path *)local_76d8,&local_76f8,&local_7738);
    ::std::__cxx11::string::~string((string *)&local_7738);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7739);
    ::std::__cxx11::string::~string((string *)&local_76f8);
    ::std::__cxx11::string::~string((string *)&local_7718);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.opacityThreshold._blocked,(Path *)local_76d8);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.opacityThreshold._blocked);
    Path::~Path((Path *)local_76d8);
  }
  else {
    Animatable<float>::Animatable(&local_7768,&(pvVar4->surfaceShader).ior.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.opacityThreshold._blocked,&local_7768);
    Animatable<float>::~Animatable(&local_7768);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).occlusion);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).occlusion.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_78e0);
      poVar8 = ::std::operator<<((ostream *)local_78e0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x482);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_78e0,
                                 "Invalid texture_id for \'occlusion\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_7900,&local_7920,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_7900);
        ::std::__cxx11::string::~string((string *)&local_7900);
        ::std::__cxx11::string::~string((string *)&local_7920);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_78e0);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).occlusion.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7940,"occlusion",&local_7941);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_7940,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_7940);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7941);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_7ac0);
      poVar8 = ::std::operator<<((ostream *)local_7ac0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x486);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_7ac0,"Failed to convert \'occlusion\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_7ae0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_10._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_7ae0);
        ::std::__cxx11::string::~string((string *)&local_7ae0);
        ::std::__cxx11::string::~string((string *)&connPath_10._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_7ac0);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_7c10,local_1598);
    ::std::operator+(&local_7bf0,&local_7c10,"occlusion");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7c30,"outputs:r",&local_7c31);
    Path::Path((Path *)local_7bd0,&local_7bf0,&local_7c30);
    ::std::__cxx11::string::~string((string *)&local_7c30);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7c31);
    ::std::__cxx11::string::~string((string *)&local_7bf0);
    ::std::__cxx11::string::~string((string *)&local_7c10);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.displacement._blocked,(Path *)local_7bd0);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.displacement._blocked);
    Path::~Path((Path *)local_7bd0);
  }
  else {
    Animatable<float>::Animatable(&local_7c60,&(pvVar4->surfaceShader).occlusion.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.displacement._blocked,&local_7c60);
    Animatable<float>::~Animatable(&local_7c60);
  }
  bVar3 = ShaderParam<std::array<float,_3UL>_>::is_texture(&(pvVar4->surfaceShader).normal);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).normal.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_7dd8);
      poVar8 = ::std::operator<<((ostream *)local_7dd8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x493);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_7dd8,"Invalid texture_id for \'normal\' texture.")
      ;
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_7df8,&local_7e18,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_7df8);
        ::std::__cxx11::string::~string((string *)&local_7df8);
        ::std::__cxx11::string::~string((string *)&local_7e18);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_7dd8);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).normal.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7e38,"normal",&local_7e39);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_7e38,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_7e38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7e39);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_7fb8);
      poVar8 = ::std::operator<<((ostream *)local_7fb8,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x497);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_7fb8,"Failed to convert \'normal\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_7fd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_11._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_7fd8);
        ::std::__cxx11::string::~string((string *)&local_7fd8);
        ::std::__cxx11::string::~string((string *)&connPath_11._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_7fb8);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_8108,local_1598);
    ::std::operator+(&local_80e8,&local_8108,"normal");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&n.z,"outputs:rgb",(allocator *)((long)&n.y + 3));
    Path::Path((Path *)local_80c8,&local_80e8,(string *)&n.z);
    ::std::__cxx11::string::~string((string *)&n.z);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&n.y + 3));
    ::std::__cxx11::string::~string((string *)&local_80e8);
    ::std::__cxx11::string::~string((string *)&local_8108);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
               &surfaceShader.ior._blocked,(Path *)local_80c8);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
               &surfaceShader.ior._blocked);
    Path::~Path((Path *)local_80c8);
  }
  else {
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).normal.value,0);
    vVar1 = *pvVar5;
    pfVar6 = tinyusdz::value::normal3f::operator[]((normal3f *)local_8138,0);
    *pfVar6 = vVar1;
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).normal.value,1);
    vVar1 = *pvVar5;
    pfVar6 = tinyusdz::value::normal3f::operator[]((normal3f *)local_8138,1);
    *pfVar6 = vVar1;
    pvVar5 = ::std::array<float,_3UL>::operator[](&(pvVar4->surfaceShader).normal.value,2);
    vVar1 = *pvVar5;
    pfVar6 = tinyusdz::value::normal3f::operator[]((normal3f *)local_8138,2);
    *pfVar6 = vVar1;
    Animatable<tinyusdz::value::normal3f>::Animatable(&local_8168,(normal3f *)local_8138);
    TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
               &surfaceShader.ior._blocked,&local_8168);
    Animatable<tinyusdz::value::normal3f>::~Animatable(&local_8168);
  }
  bVar3 = ShaderParam<float>::is_texture(&(pvVar4->surfaceShader).displacement);
  if (bVar3) {
    iVar2 = (pvVar4->surfaceShader).displacement.texture_id;
    sVar7 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>::
            size(&scene->textures);
    if (sVar7 < (ulong)(long)iVar2) {
      ::std::__cxx11::ostringstream::ostringstream(local_82e0);
      poVar8 = ::std::operator<<((ostream *)local_82e0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x4a8);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_82e0,
                                 "Invalid texture_id for \'displacement\' texture.");
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_8300,&local_8320,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_8300);
        ::std::__cxx11::string::~string((string *)&local_8300);
        ::std::__cxx11::string::~string((string *)&local_8320);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_82e0);
      goto LAB_00491cce;
    }
    pvVar9 = ::std::vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
             ::operator[](&scene->textures,(long)(pvVar4->surfaceShader).displacement.texture_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8340,"displacement",&local_8341);
    bVar3 = ToMaterialPrim::anon_class_16_2_2591ee82::operator()
                      ((anon_class_16_2_2591ee82 *)&mat.volume._listOpQual,pvVar9,&local_8340,
                       (string *)local_1598,
                       (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
                       ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
    ::std::__cxx11::string::~string((string *)&local_8340);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8341);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_84c0);
      poVar8 = ::std::operator<<((ostream *)local_84c0,"[error]");
      poVar8 = ::std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                );
      poVar8 = ::std::operator<<(poVar8,":");
      poVar8 = ::std::operator<<(poVar8,"ToMaterialPrim");
      poVar8 = ::std::operator<<(poVar8,"():");
      poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x4ac);
      ::std::operator<<(poVar8," ");
      poVar8 = ::std::operator<<((ostream *)local_84c0,"Failed to convert \'displacement\' texture."
                                );
      ::std::operator<<(poVar8,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_84e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &connPath_12._valid,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_84e0);
        ::std::__cxx11::string::~string((string *)&local_84e0);
        ::std::__cxx11::string::~string((string *)&connPath_12._valid);
      }
      scene_local._7_1_ = 0;
      local_473c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_84c0);
      goto LAB_00491cce;
    }
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_8610,local_1598);
    ::std::operator+(&local_85f0,&local_8610,"displacement");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8630,"outputs:rgb",&local_8631);
    Path::Path((Path *)local_85d0,&local_85f0,&local_8630);
    ::std::__cxx11::string::~string((string *)&local_8630);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8631);
    ::std::__cxx11::string::~string((string *)&local_85f0);
    ::std::__cxx11::string::~string((string *)&local_8610);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_connection
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.normal._blocked,(Path *)local_85d0);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::set_value_empty
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.normal._blocked);
    Path::~Path((Path *)local_85d0);
  }
  else {
    Animatable<float>::Animatable(&local_8660,&(pvVar4->surfaceShader).displacement.value);
    TypedAttributeWithFallback<tinyusdz::Animatable<float>_>::operator=
              ((TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
               &surfaceShader.normal._blocked,&local_8660);
    Animatable<float>::~Animatable(&local_8660);
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_8750,"outputs:surface",
             (allocator *)
             ((long)&shaderPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  Path::Path(&local_8730,(string *)local_15d8,&local_8750);
  TypedConnection<tinyusdz::Token>::set
            ((TypedConnection<tinyusdz::Token> *)
             &mat.super_UsdShadePrim._properties.
              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_8730);
  Path::~Path(&local_8730);
  ::std::__cxx11::string::~string((string *)&local_8750);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&shaderPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  tinyusdz::value::Value::operator=
            ((Value *)((long)&shader.info_id.field_2 + 8),(UsdPreviewSurface *)local_4550);
  local_473c = 0;
LAB_00491cce:
  UsdPreviewSurface::~UsdPreviewSurface((UsdPreviewSurface *)local_4550);
  if (local_473c == 0) {
    Prim::Prim<tinyusdz::Shader>
              ((Prim *)&matPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Shader *)((long)&abs_mat_path.field_2 + 8));
    Prim::Prim<tinyusdz::Material>((Prim *)&__range2,(Material *)&shader.value.v_.vtable);
    Prim::add_child((Prim *)&__range2,
                    (Prim *)&matPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    true,(string *)0x0);
    this = (vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
           ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8);
    __end2 = ::std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>::begin(this);
    node = (Shader *)::std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>::end(this);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<tinyusdz::Shader_*,_std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>_>
                                       *)&node), bVar3) {
      shaderNodePrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)__gnu_cxx::
                   __normal_iterator<tinyusdz::Shader_*,_std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>_>
                   ::operator*(&__end2);
      Prim::Prim<tinyusdz::Shader>
                ((Prim *)local_9168,
                 (Shader *)
                 shaderNodePrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar3 = Prim::add_child((Prim *)&__range2,(Prim *)local_9168,false,err);
      if (!bVar3) {
        scene_local._7_1_ = 0;
      }
      local_473c = (uint)!bVar3;
      Prim::~Prim((Prim *)local_9168);
      if (local_473c != 0) goto LAB_00491e22;
      __gnu_cxx::
      __normal_iterator<tinyusdz::Shader_*,_std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>_>
      ::operator++(&__end2);
    }
    Prim::operator=(dst,(Prim *)&__range2);
    scene_local._7_1_ = 1;
    local_473c = 1;
LAB_00491e22:
    Prim::~Prim((Prim *)&__range2);
    Prim::~Prim((Prim *)&matPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  ::std::vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_>::~vector
            ((vector<tinyusdz::Shader,_std::allocator<tinyusdz::Shader>_> *)
             ((long)&surfaceShader.outputsDisplacement._actual_type_name.field_2 + 8));
  ::std::__cxx11::string::~string((string *)local_15d8);
  ::std::__cxx11::string::~string((string *)local_1598);
  Shader::~Shader((Shader *)((long)&abs_mat_path.field_2 + 8));
  Material::~Material((Material *)&shader.value.v_.vtable);
  return (bool)(scene_local._7_1_ & 1);
}

Assistant:

static bool ToMaterialPrim(const RenderScene &scene, const std::string &abs_path, size_t material_id, Prim *dst, std::string *err) {

  const RenderMaterial &rmat = scene.materials[material_id];

  // TODO: create two UsdUVTextures for RGBA imagge(rgb and alpha)
  auto ConstructUVTexture = [&](const UVTexture &tex, const std::string &param_name, const std::string &abs_mat_path, /* inout */std::vector<Shader> &shader_nodes) -> bool {


    std::string preaderPrimPath = abs_mat_path + "/uvmap_" + param_name + ".outputs:result";
    Path preaderPath(preaderPrimPath, "");

    if ((tex.texture_image_id < 0) || (size_t(tex.texture_image_id) >= scene.images.size())) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture_image_id for `{}`", param_name));
    }

    const TextureImage &src_teximg = scene.images[size_t(tex.texture_image_id)];

    UsdUVTexture image_tex;
    image_tex.name = "Image_Texture_" + param_name;

    DCOUT("asset_identifier: " << src_teximg.asset_identifier);
    if (src_teximg.asset_identifier.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format("file asset name is empty for texture image `{}`", param_name));
    }
    value::AssetPath fileAssetPath(src_teximg.asset_identifier);
    image_tex.file = fileAssetPath;

    // TODO: Set colorSpace in attribute meta.
    Animatable<UsdUVTexture::SourceColorSpace> sourceColorSpace;
    if (src_teximg.colorSpace == ColorSpace::sRGB) {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::SRGB);
    } else if (src_teximg.colorSpace == ColorSpace::Raw) {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::Raw);
    } else {
      sourceColorSpace.set_default(UsdUVTexture::SourceColorSpace::Auto);
    }
    image_tex.sourceColorSpace.set_value(sourceColorSpace);
    
    image_tex.st.set_connection(preaderPath);
    image_tex.st.set_value_empty(); // connection only

    Animatable<UsdUVTexture::Wrap> wrapS;
    if (tex.wrapS == UVTexture::WrapMode::CLAMP_TO_EDGE) {
      wrapS.set_default(UsdUVTexture::Wrap::Clamp);
    } else if (tex.wrapS == UVTexture::WrapMode::REPEAT) {
      wrapS.set_default(UsdUVTexture::Wrap::Repeat);
    } else if (tex.wrapS == UVTexture::WrapMode::MIRROR) {
      wrapS.set_default(UsdUVTexture::Wrap::Mirror);
    } else if (tex.wrapS == UVTexture::WrapMode::CLAMP_TO_BORDER) {
      wrapS.set_default(UsdUVTexture::Wrap::Black);
    } else {
      wrapS.set_default(UsdUVTexture::Wrap::Repeat);
    }
    image_tex.wrapS.set_value(wrapS);

    Animatable<UsdUVTexture::Wrap> wrapT;
    if (tex.wrapT == UVTexture::WrapMode::CLAMP_TO_EDGE) {
      wrapT.set_default(UsdUVTexture::Wrap::Clamp);
    } else if (tex.wrapT == UVTexture::WrapMode::REPEAT) {
      wrapT.set_default(UsdUVTexture::Wrap::Repeat);
    } else if (tex.wrapT == UVTexture::WrapMode::MIRROR) {
      wrapT.set_default(UsdUVTexture::Wrap::Mirror);
    } else if (tex.wrapT == UVTexture::WrapMode::CLAMP_TO_BORDER) {
      wrapT.set_default(UsdUVTexture::Wrap::Black);
    } else {
      wrapT.set_default(UsdUVTexture::Wrap::Repeat);
    }
    image_tex.wrapT.set_value(wrapS);

    for (const auto &c : tex.authoredOutputChannels) {
      if (c == UVTexture::Channel::R) {
        image_tex.outputsR.set_authored(true);
      } else if (c == UVTexture::Channel::G) {
        image_tex.outputsG.set_authored(true);
      } else if (c == UVTexture::Channel::B) {
        image_tex.outputsB.set_authored(true);
      } else if (c == UVTexture::Channel::RGB) {
        image_tex.outputsRGB.set_authored(true);
      } else if (c == UVTexture::Channel::RGBA) {
        PUSH_ERROR_AND_RETURN("rgba texture is not supported yet.");
      } 
    }

    UsdTransform2d uv_xform;
    uv_xform.name = "place2d_" + param_name;
    if (tex.has_transform2d) {
      // TODO: Deompose tex.transform and use it?
      uv_xform.translation = tex.tx_translation;
      uv_xform.rotation = tex.tx_rotation;
      uv_xform.scale = tex.tx_scale;

      Shader uv_xformShader;
      uv_xformShader.name = "place2d_" + param_name;
      uv_xformShader.info_id = tinyusdz::kUsdTransform2d;
      uv_xformShader.value = uv_xform;
      shader_nodes.emplace_back(std::move(uv_xformShader));
    }

    UsdPrimvarReader_float2 preader;
    preader.name = "primvar_reader_" + param_name;

    value::float2 fallback_value;
    fallback_value[0] = tex.fallback_uv[0];
    fallback_value[1] = tex.fallback_uv[1];
    if (!math::is_close(fallback_value, {0.0f, 0.0f})) {
      preader.fallback = fallback_value;
    }

    Animatable<std::string> varname;
    // TODO: Ensure primvar with 'varname_uv' exists in bound RenderMesh.
    DCOUT("varname = " << tex.varname_uv);
    varname.set_default(tex.varname_uv);
    preader.varname.set_value(varname);
    preader.result.set_authored(true);


    Shader preaderShader;
    preaderShader.name = "uvmap_" + param_name;
    preaderShader.info_id = tinyusdz::kUsdPrimvarReader_float2;
    preaderShader.value = preader;

    shader_nodes.emplace_back(std::move(preaderShader));

    Shader imageTexShader;
    imageTexShader.name = "Image_Texture_" + param_name;
    imageTexShader.info_id = tinyusdz::kUsdUVTexture;
    imageTexShader.value = image_tex;

    shader_nodes.emplace_back(std::move(imageTexShader));
    
    return true;
  };


  // Layout
  //
  // - Material
  //   - Shader(UsdPreviewSurface)
  //     - UsdUVTexture(Shader)
  //     - TexTransform2d(Shader)
  //     - PrimvarReader
  //

  Material mat;

  mat.name = rmat.name;

  Shader shader;  // root Shader 
  shader.name = "defaultPBR";

  std::string abs_mat_path = abs_path + "/" + mat.name;
  std::string abs_shader_path = abs_mat_path + "/" + shader.name;

  std::vector<Shader> shader_nodes;
  
  {
    UsdPreviewSurface surfaceShader;  // Concrete Shader node object

    //
    // Asssign actual shader object to Shader::value.
    // Also do not forget set its shader node type name through Shader::info_id
    //
    shader.info_id = tinyusdz::kUsdPreviewSurface;  // "UsdPreviewSurface" token

    //
    // Currently no shader network/connection API.
    // Manually construct it.
    //
    surfaceShader.outputsSurface.set_authored(
        true);  // Author `token outputs:surface`

    surfaceShader.useSpecularWorkflow = rmat.surfaceShader.useSpecularWorkflow ? 1 : 0;

    if (rmat.surfaceShader.diffuseColor.is_texture()) {

      if (size_t(rmat.surfaceShader.diffuseColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'diffuseColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.diffuseColor.texture_id)], "diffuseColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'diffuseColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "diffuseColor", "outputs:rgb");
      surfaceShader.diffuseColor.set_connection(connPath);
      surfaceShader.diffuseColor.set_value_empty();
    } else {
      value::color3f diffuseCol;
      diffuseCol.r = rmat.surfaceShader.diffuseColor.value[0];
      diffuseCol.g = rmat.surfaceShader.diffuseColor.value[1];
      diffuseCol.b = rmat.surfaceShader.diffuseColor.value[2];

      surfaceShader.diffuseColor.set_value(diffuseCol);
    }

    if (rmat.surfaceShader.specularColor.is_texture()) {

      if (size_t(rmat.surfaceShader.specularColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'specularColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.specularColor.texture_id)], "specularColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'specularColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "specularColor", "outputs:rgb");
      surfaceShader.specularColor.set_connection(connPath);
      surfaceShader.specularColor.set_value_empty();
    } else {
      value::color3f col;
      col.r = rmat.surfaceShader.specularColor.value[0];
      col.g = rmat.surfaceShader.specularColor.value[1];
      col.b = rmat.surfaceShader.specularColor.value[2];
      surfaceShader.specularColor = col;
    }

    if (rmat.surfaceShader.emissiveColor.is_texture()) {

      if (size_t(rmat.surfaceShader.emissiveColor.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'emissiveColor' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.emissiveColor.texture_id)], "emissiveColor", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'emissiveColor' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "emissiveColor", "outputs:rgb");
      surfaceShader.emissiveColor.set_connection(connPath);
      surfaceShader.emissiveColor.set_value_empty();
    } else {
      value::color3f col;
      col.r = rmat.surfaceShader.emissiveColor.value[0];
      col.g = rmat.surfaceShader.emissiveColor.value[1];
      col.b = rmat.surfaceShader.emissiveColor.value[2];
      surfaceShader.emissiveColor = col;
    }

    if (rmat.surfaceShader.metallic.is_texture()) {

      if (size_t(rmat.surfaceShader.metallic.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'metallic' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.metallic.texture_id)], "metallic", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'metallic' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "metallic", "outputs:r");
      surfaceShader.metallic.set_connection(connPath);
      surfaceShader.metallic.set_value_empty();
    } else {
      surfaceShader.metallic = rmat.surfaceShader.metallic.value;
    }

    if (rmat.surfaceShader.roughness.is_texture()) {

      if (size_t(rmat.surfaceShader.roughness.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'roughness' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.roughness.texture_id)], "roughness", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'roughness' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "roughness", "outputs:r");
      surfaceShader.roughness.set_connection(connPath);
      surfaceShader.roughness.set_value_empty();
    } else {
      surfaceShader.roughness = rmat.surfaceShader.roughness.value;
    }

    if (rmat.surfaceShader.clearcoat.is_texture()) {

      if (size_t(rmat.surfaceShader.clearcoat.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'clearcoat' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.clearcoat.texture_id)], "clearcoat", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'clearcoat' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "clearcoat", "outputs:r");
      surfaceShader.clearcoat.set_connection(connPath);
      surfaceShader.clearcoat.set_value_empty();
    } else {
      surfaceShader.clearcoat = rmat.surfaceShader.clearcoat.value;
    }

    if (rmat.surfaceShader.clearcoatRoughness.is_texture()) {

      if (size_t(rmat.surfaceShader.clearcoatRoughness.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'clearcoatRoughness' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.clearcoatRoughness.texture_id)], "clearcoatRoughness", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'clearcoatRoughness' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "clearcoatRoughness", "outputs:r");
      surfaceShader.clearcoatRoughness.set_connection(connPath);
      surfaceShader.clearcoatRoughness.set_value_empty();
    } else {
      surfaceShader.clearcoatRoughness = rmat.surfaceShader.clearcoatRoughness.value;
    }

    if (rmat.surfaceShader.opacity.is_texture()) {

      if (size_t(rmat.surfaceShader.opacity.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'opacity' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.opacity.texture_id)], "opacity", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'opacity' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "opacity", "outputs:r");
      surfaceShader.opacity.set_connection(connPath);
      surfaceShader.opacity.set_value_empty();
    } else {
      surfaceShader.opacity = rmat.surfaceShader.opacity.value;
    }

    if (rmat.surfaceShader.opacityThreshold.is_texture()) {

      if (size_t(rmat.surfaceShader.opacityThreshold.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'opacityThreshold' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.opacityThreshold.texture_id)], "opacityThreshold", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'opacityThreshold' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "opacityThreshold", "outputs:r");
      surfaceShader.opacityThreshold.set_connection(connPath);
      surfaceShader.opacityThreshold.set_value_empty();
    } else {
      surfaceShader.opacityThreshold = rmat.surfaceShader.opacityThreshold.value;
    }

    if (rmat.surfaceShader.ior.is_texture()) {

      if (size_t(rmat.surfaceShader.ior.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'ior' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.ior.texture_id)], "ior", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'ior' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "ior", "outputs:r");
      surfaceShader.ior.set_connection(connPath);
      surfaceShader.ior.set_value_empty();
    } else {
      surfaceShader.ior = rmat.surfaceShader.ior.value;
    }

    if (rmat.surfaceShader.occlusion.is_texture()) {

      if (size_t(rmat.surfaceShader.occlusion.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'occlusion' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.occlusion.texture_id)], "occlusion", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'occlusion' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "occlusion", "outputs:r");
      surfaceShader.occlusion.set_connection(connPath);
      surfaceShader.occlusion.set_value_empty();
    } else {
      surfaceShader.occlusion = rmat.surfaceShader.occlusion.value;
    }

    if (rmat.surfaceShader.normal.is_texture()) {

      if (size_t(rmat.surfaceShader.normal.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'normal' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.normal.texture_id)], "normal", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'normal' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "normal", "outputs:rgb");
      surfaceShader.normal.set_connection(connPath);
      surfaceShader.normal.set_value_empty();
    } else {
      value::normal3f n;
      n[0] = rmat.surfaceShader.normal.value[0];
      n[1] = rmat.surfaceShader.normal.value[1];
      n[2] = rmat.surfaceShader.normal.value[2];
      surfaceShader.normal = n;
    }

    if (rmat.surfaceShader.displacement.is_texture()) {

      if (size_t(rmat.surfaceShader.displacement.texture_id) > scene.textures.size()) {
        PUSH_ERROR_AND_RETURN("Invalid texture_id for 'displacement' texture.");
      }
    
      if (!ConstructUVTexture(scene.textures[size_t(rmat.surfaceShader.displacement.texture_id)], "displacement", abs_mat_path, shader_nodes)) {
        PUSH_ERROR_AND_RETURN("Failed to convert 'displacement' texture.");
      }

      Path connPath(abs_mat_path + "/Image_Texture_" + "displacement", "outputs:rgb");
      surfaceShader.displacement.set_connection(connPath);
      surfaceShader.displacement.set_value_empty();
    
    } else {
      surfaceShader.displacement = rmat.surfaceShader.displacement.value;
    }

    // Connect to UsdPreviewSurface's outputs:surface by setting targetPath.
    //
    // token outputs:surface = </path/to/mat/defaultPBR.outputs:surface>
    mat.surface.set(tinyusdz::Path(/* prim path */ abs_shader_path,
                                   /* prop path */ "outputs:surface"));

    //
    // Shaer::value is `value::Value` type, so can use '=' to assign Shader
    // object.
    //
    shader.value = std::move(surfaceShader);
  }

  Prim shaderPrim(shader);

  Prim matPrim(mat);

  matPrim.add_child(std::move(shaderPrim));

  for (const auto &node : shader_nodes) {
    Prim shaderNodePrim(node);
    
    if (!matPrim.add_child(std::move(shaderNodePrim), /* rename_primname */false, err)) {
      return false;
    } 
  }
  
  (*dst) = std::move(matPrim);
  return true;
}